

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_SignPsbt_Test::TestBody(cfdcapi_psbt_SignPsbt_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t in_stack_00000288;
  uint32_t in_stack_0000028c;
  char *in_stack_00000290;
  char *in_stack_00000298;
  int in_stack_000002a4;
  void *in_stack_000002a8;
  void **in_stack_000002c0;
  bool *in_stack_fffffffffffffd98;
  AssertionResult *in_stack_fffffffffffffda0;
  CfdErrorCode *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  undefined7 in_stack_fffffffffffffe58;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  AssertionResult local_140;
  AssertHelper in_stack_fffffffffffffed0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  void *in_stack_fffffffffffffee8;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  char *pcVar5;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar6;
  void *in_stack_ffffffffffffff68;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8))
  ;
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x383b7a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x383bdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x383c32);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(type *)0x383c66);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(internal *)&local_60,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x383d62);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x383ddd);
  uVar6 = 1;
  pcVar5 = (char *)0x0;
  pcVar3 = 
  "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACIGAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHGJ1rbYYsAACAAAAAgAAAAIAAAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
  ;
  local_b8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_000002a8,in_stack_000002a4,in_stack_00000298,
                                 in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                                 in_stack_000002c0);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x383ef9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x127,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x383f5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x383fb4);
  if (local_14 == 0) {
    local_14 = CfdSignPsbt(in_stack_ffffffffffffff68,
                           (void *)CONCAT44(uVar6,in_stack_ffffffffffffff60),pcVar5,
                           SUB81((ulong)pcVar3 >> 0x38,0));
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar2) {
      testing::Message::Message(&local_100);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x384091);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x12a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x3840ee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x384146);
    local_14 = CfdGetPsbtData(in_stack_fffffffffffffee8,
                              (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (char **)in_stack_fffffffffffffed8.ptr_,
                              (char **)in_stack_fffffffffffffed0.data_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffee8);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffed8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38420f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffed0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x12d,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffed0,(Message *)&stack0xfffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed0);
      testing::Message::~Message((Message *)0x38426c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3842c1);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_140,"exp_psbt_base64","output",pcVar3,local_b8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar2) {
        testing::Message::Message(&local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x384365);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x12f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x3843c2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x384417);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffda8);
      local_b8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle((void *)CONCAT17(uVar1,in_stack_fffffffffffffe58),pAVar4);
    local_164 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar2) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3844ef);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x135,pcVar3);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message((Message *)0x38454c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3845a1);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffda8);
  local_18c = 0;
  pAVar4 = &local_188;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),&pAVar4->success_
             ,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x384658);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x139,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x3846b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38470a);
  return;
}

Assistant:

TEST(cfdcapi_psbt, SignPsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACIGAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHGJ1rbYYsAACAAAAAgAAAAIAAAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQMEAQAAAAEEFgAUlixOCPM206+8NBXJ01muEEBHBSAiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSignPsbt(handle, psbt_handle, "KwNwembMPPQpgFfbhb5WPCgENwhnTaNQjf3a6cBuBiZ993Gu5gaR", true);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}